

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::stringPrintfRecursive<pbrt::FileLoc_const&>(string *s,char *fmt,FileLoc *v)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  string *in_RDI;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffde0;
  char **in_stack_fffffffffffffde8;
  char **in_stack_fffffffffffffdf0;
  FileLoc *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  string local_1f8 [32];
  stringstream local_1d8 [48];
  char *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  LogLevel in_stack_fffffffffffffe74;
  string local_38 [48];
  string *local_8;
  
  local_8 = in_RDI;
  copyToFormatString(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  lVar1 = std::__cxx11::string::find((char)local_38,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_38,0x73);
  lVar3 = std::__cxx11::string::find((char)local_38,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
             in_stack_fffffffffffffe58);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
             in_stack_fffffffffffffe58);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
               in_stack_fffffffffffffe58);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::FileLoc_const&>(in_stack_fffffffffffffdc8,(FileLoc *)in_stack_fffffffffffffdc0);
    std::__cxx11::string::operator+=(local_8,(string *)&stack0xfffffffffffffdc0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1d8);
    pbrt::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffdb8 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::__cxx11::string::operator+=(local_8,local_1f8);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffde0);
    std::__cxx11::stringstream::~stringstream(local_1d8);
  }
  stringPrintfRecursive(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}